

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O3

int __thiscall
FIWadManager::IdentifyVersion
          (FIWadManager *this,TArray<FString,_FString> *wadfiles,char *iwad,char *zdoom_wad)

{
  WadStuff *this_00;
  FIWADInfo *pFVar1;
  FString FVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  FIWADInfo *pFVar12;
  long lVar13;
  char *unaff_RBP;
  undefined7 uVar14;
  WadStuff *pWVar15;
  ulong uVar16;
  unsigned_long *puVar17;
  FIWadManager *pFVar18;
  TArray<WadStuff,_WadStuff> wads;
  TArray<FString,_FString> gog_paths;
  FString custwad;
  TArray<unsigned_long,_unsigned_long> foundwads;
  TArray<FString,_FString> steam_path;
  FString nice;
  TArray<WadStuff,_WadStuff> local_c8;
  FIWadManager *local_b0;
  TArray<FString,_FString> *local_a8;
  UCVarValue local_a0;
  uint local_94;
  FString local_90;
  TArray<unsigned_long,_unsigned_long> local_88;
  ulong local_78;
  TArray<FString,_FString> local_70;
  undefined4 local_5c;
  ulong local_58;
  FString local_50;
  char *local_48;
  ulong local_40;
  UCVarValue local_38;
  
  local_c8.Array = (WadStuff *)0x0;
  local_c8.Most = 0;
  local_c8.Count = 0;
  local_88.Array = (unsigned_long *)0x0;
  local_88.Most = 0;
  local_88.Count = 0;
  local_a8 = wadfiles;
  local_48 = zdoom_wad;
  pcVar8 = DArgs::CheckValue(Args,"-iwad");
  local_38 = (UCVarValue)FString::NullString.Nothing;
  local_90.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  TArray<WadStuff,_WadStuff>::Resize(&local_c8,(this->mIWadNames).Count);
  uVar7 = (this->mIWads).Count;
  if (local_88.Count <= uVar7 && uVar7 - local_88.Count != 0) {
    TArray<unsigned_long,_unsigned_long>::Grow(&local_88,uVar7 - local_88.Count);
  }
  local_88.Count = uVar7;
  memset(local_88.Array,0,(ulong)uVar7 * 8);
  uVar14 = (undefined7)((ulong)pcVar8 >> 8);
  if (iwad == (char *)0x0 || pcVar8 != (char *)0x0) {
    if (pcVar8 == (char *)0x0) goto LAB_004b7781;
LAB_004b778e:
    FString::operator=(&local_90,pcVar8);
    FString::ReplaceChars(&local_90,'\\','/');
    iVar6 = CheckIWAD(this,local_90.Chars,local_c8.Array);
    uVar9 = CONCAT71(uVar14,1);
    if (iVar6 == 0) {
      DefaultExtension(&local_90,".wad");
      FVar2.Chars = local_90.Chars;
      FString::operator=((this->mIWadNames).Array,&local_90);
      CheckIWAD(this,(char *)"",local_c8.Array);
      if (FVar2.Chars != (char *)0x0) {
        if (*(int *)(((local_c8.Array)->Path).Chars + -0xc) == 0) {
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          unaff_RBP = (char *)0x0;
          local_5c = 0;
          if (*(int *)((this->mIWads).Array[(local_c8.Array)->Type].Required.Chars + -0xc) == 0)
          goto LAB_004b78f7;
        }
      }
    }
  }
  else {
    pcVar8 = iwad;
    if (*iwad != '\0') goto LAB_004b778e;
LAB_004b7781:
    uVar9 = CONCAT71(uVar14,1);
  }
  bVar5 = FConfigFile::SetSection(&GameConfig->super_FConfigFile,"IWADSearch.Directories",false);
  if (bVar5) {
    local_b0 = (FIWadManager *)CONCAT44(local_b0._4_4_,(int)uVar9);
    unaff_RBP = "Path";
    while (bVar5 = FConfigFile::NextInSection
                             (&GameConfig->super_FConfigFile,&local_a0.String,(char **)&local_70),
          bVar5) {
      iVar6 = strcasecmp(local_a0.String,"Path");
      if (iVar6 == 0) {
        NicePath((char *)&local_50);
        FString::ReplaceChars(&local_50,'\\','/');
        CheckIWAD(this,local_50.Chars,local_c8.Array);
        FString::~FString(&local_50);
      }
    }
    uVar9 = (ulong)local_b0 & 0xffffffff;
  }
  I_GetGogPaths();
  if (local_94 != 0) {
    uVar10 = 0;
    do {
      CheckIWAD(this,*(char **)(local_a0.String + uVar10 * 8),local_c8.Array);
      uVar10 = uVar10 + 1;
    } while (uVar10 < local_94);
  }
  I_GetSteamPath();
  if (local_70.Count != 0) {
    uVar10 = 0;
    do {
      CheckIWAD(this,local_70.Array[uVar10].Chars,local_c8.Array);
      uVar10 = uVar10 + 1;
    } while (uVar10 < local_70.Count);
  }
  TArray<FString,_FString>::~TArray(&local_70);
  TArray<FString,_FString>::~TArray((TArray<FString,_FString> *)&local_a0);
  uVar14 = (undefined7)((ulong)unaff_RBP >> 8);
  local_5c = (undefined4)CONCAT71(uVar14,1);
  if ((char)uVar9 == '\0') {
    local_5c = (undefined4)CONCAT71(uVar14,*(int *)(((local_c8.Array)->Path).Chars + -0xc) == 0);
  }
LAB_004b78f7:
  uVar7 = (this->mIWadNames).Count;
  local_b0 = this;
  if (uVar7 == 0) {
    local_78 = 0;
  }
  else {
    lVar11 = 0;
    uVar10 = 0;
    uVar9 = 0;
    pWVar15 = local_c8.Array;
    do {
      local_78 = uVar9;
      if (*(int *)(*(long *)((long)&(pWVar15->Path).Chars + lVar11) + -0xc) != 0) {
        if (uVar10 != uVar9) {
          this_00 = pWVar15 + uVar9;
          FString::operator=(&this_00->Path,(FString *)((long)&(pWVar15->Path).Chars + lVar11));
          FString::operator=(&this_00->Name,(FString *)((long)&(pWVar15->Name).Chars + lVar11));
          this_00->Type = *(int *)((long)&pWVar15->Type + lVar11);
          uVar7 = (local_b0->mIWadNames).Count;
          pWVar15 = local_c8.Array;
        }
        local_78 = uVar9 + 1;
        local_88.Array[pWVar15[uVar9].Type] = local_78;
      }
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 0x18;
      uVar9 = local_78;
    } while (uVar10 < uVar7);
  }
  uVar7 = (local_b0->mIWads).Count;
  uVar9 = (ulong)uVar7;
  pFVar18 = local_b0;
  if (uVar7 != 0) {
    uVar10 = 0;
    do {
      puVar17 = local_88.Array;
      pFVar1 = (pFVar18->mIWads).Array;
      pcVar8 = pFVar1[uVar10].Required.Chars;
      if ((*(int *)(pcVar8 + -0xc) != 0) && (pFVar18 = local_b0, local_88.Array[uVar10] != 0)) {
        uVar16 = 0;
        pFVar12 = pFVar1;
        local_58 = uVar10;
        local_40 = local_88.Array[uVar10];
        do {
          iVar6 = strcmp(pcVar8,(pFVar12->Name).Chars);
          uVar4 = local_40;
          uVar3 = local_78;
          if (iVar6 == 0) {
            if (puVar17[uVar16] != 0) {
              pFVar1[uVar10].preload = (int)uVar16;
              uVar10 = local_58;
              pFVar18 = local_b0;
              goto LAB_004b7abb;
            }
            break;
          }
          uVar16 = uVar16 + 1;
          pFVar12 = pFVar12 + 1;
        } while ((int)uVar9 + (uint)((int)uVar9 == 0) != uVar16);
        lVar11 = local_78 - local_40;
        if (local_40 <= local_78 && lVar11 != 0) {
          lVar13 = local_40 * 0x18;
          do {
            pWVar15 = local_c8.Array;
            FString::operator=((FString *)((long)&local_c8.Array[-1].Path.Chars + lVar13),
                               (FString *)((long)&((local_c8.Array)->Path).Chars + lVar13));
            FString::operator=((FString *)((long)pWVar15 + lVar13 + -0x10),
                               (FString *)((long)&(pWVar15->Name).Chars + lVar13));
            *(undefined4 *)((long)pWVar15 + lVar13 + -8) =
                 *(undefined4 *)((long)&pWVar15->Type + lVar13);
            lVar13 = lVar13 + 0x18;
            lVar11 = lVar11 + -1;
            puVar17 = local_88.Array;
          } while (lVar11 != 0);
        }
        local_78 = uVar3 - 1;
        puVar17[local_58] = 0;
        uVar10 = local_58;
        pFVar18 = local_b0;
        if ((ulong)local_88._8_8_ >> 0x20 != 0) {
          uVar9 = 0;
          do {
            if (uVar4 < puVar17[uVar9]) {
              puVar17[uVar9] = puVar17[uVar9] - 1;
            }
            uVar9 = uVar9 + 1;
          } while ((ulong)local_88._8_8_ >> 0x20 != uVar9);
        }
      }
LAB_004b7abb:
      uVar10 = uVar10 + 1;
      uVar9 = (ulong)(pFVar18->mIWads).Count;
    } while (uVar10 < uVar9);
  }
  if (local_78 == 0) {
    uVar9 = 0;
    I_FatalError(
                "Cannot find a game IWAD (doom.wad, doom2.wad, heretic.wad, etc.).\nDid you install GZDoom properly? You can do either of the following:\n\n1. Place one or more of these wads in ~/.config/gzdoom/.\n2. Edit your ~/.config/gzdoom/gzdoom.ini and add the directories of your\niwads to the list beneath [IWADSearch.Directories]"
                );
  }
  else {
    uVar9 = 0;
    if ((char)local_5c == '\x01' && local_78 != 1) {
      if (*defaultiwad.Value != '\0') {
        lVar11 = 0;
        uVar9 = 0;
        do {
          ExtractFileBase((char *)&local_a0.Int,
                          SUB81(*(undefined8 *)((long)&((local_c8.Array)->Path).Chars + lVar11),0));
          iVar6 = strcasecmp(local_a0.String,defaultiwad.Value);
          FString::~FString((FString *)&local_a0);
          if (iVar6 == 0) goto LAB_004b7bef;
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + 0x18;
        } while (local_78 != uVar9);
        uVar9 = 0;
      }
LAB_004b7bef:
      if (havepicked == '\0') {
        uVar7 = I_PickIWad(local_c8.Array,(int)local_78,queryiwad.Value,(int)uVar9);
        if ((int)uVar7 < 0) {
          exit(0);
        }
        uVar9 = (ulong)uVar7;
        ExtractFileBase((char *)&local_a0.Int,SUB81(local_c8.Array[uVar9].Path.Chars,0));
        FBaseCVar::SetGenericRep(&defaultiwad.super_FBaseCVar,local_a0,CVAR_String);
        FString::~FString((FString *)&local_a0);
        havepicked = '\x01';
      }
      else {
        uVar9 = 0;
      }
    }
  }
  if (local_a8->Count != 0) {
    TArray<FString,_FString>::DoDelete(local_a8,0,local_a8->Count - 1);
    local_a8->Count = 0;
  }
  D_AddFile(local_a8,local_48,true,-1);
  lVar11 = (long)(pFVar18->mIWads).Array[local_c8.Array[uVar9].Type].preload;
  if (-1 < lVar11) {
    D_AddFile(local_a8,local_c8.Array[local_88.Array[lVar11] - 1].Path.Chars,true,-1);
  }
  D_AddFile(local_a8,local_c8.Array[uVar9].Path.Chars,true,-1);
  iVar6 = local_c8.Array[uVar9].Type;
  if ((pFVar18->mIWads).Array[iVar6].Load.Count != 0) {
    pWVar15 = local_c8.Array + uVar9;
    lVar11 = 0;
    uVar10 = 0;
    do {
      lVar13 = FString::LastIndexOf(&pWVar15->Path,'/');
      local_a0 = local_38;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      if (lVar13 == -1) {
        FString::operator=((FString *)&local_a0,(char *)"");
      }
      else {
        FString::FString((FString *)&local_70,local_c8.Array[uVar9].Path.Chars,lVar13 + 1);
        FString::operator=((FString *)&local_a0,(FString *)&local_70);
        FString::~FString((FString *)&local_70);
      }
      FString::operator+=((FString *)&local_a0,
                          (FString *)
                          ((long)&((local_b0->mIWads).Array[local_c8.Array[uVar9].Type].Load.Array)
                                  ->Chars + lVar11));
      D_AddFile(local_a8,local_a0.String,true,-1);
      FString::~FString((FString *)&local_a0);
      uVar10 = uVar10 + 1;
      pWVar15 = local_c8.Array + uVar9;
      iVar6 = pWVar15->Type;
      lVar11 = lVar11 + 8;
    } while (uVar10 < (local_b0->mIWads).Array[iVar6].Load.Count);
  }
  FString::~FString(&local_90);
  TArray<unsigned_long,_unsigned_long>::~TArray(&local_88);
  TArray<WadStuff,_WadStuff>::~TArray(&local_c8);
  return iVar6;
}

Assistant:

int FIWadManager::IdentifyVersion (TArray<FString> &wadfiles, const char *iwad, const char *zdoom_wad)
{
	TArray<WadStuff> wads;
	TArray<size_t> foundwads;
	const char *iwadparm = Args->CheckValue ("-iwad");
	int pickwad;
	size_t numwads;
	size_t i;
	bool iwadparmfound = false;
	FString custwad;

	wads.Resize(mIWadNames.Size());
	foundwads.Resize(mIWads.Size());
	memset(&foundwads[0], 0, foundwads.Size() * sizeof(foundwads[0]));

	if (iwadparm == NULL && iwad != NULL && *iwad != 0)
	{
		iwadparm = iwad;
	}

	if (iwadparm)
	{
		custwad = iwadparm;
		FixPathSeperator (custwad);
		if (CheckIWAD (custwad, &wads[0]))
		{ // -iwad parameter was a directory
			iwadparm = NULL;
		}
		else
		{
			DefaultExtension (custwad, ".wad");
			iwadparm = custwad;
			mIWadNames[0] = custwad;
			CheckIWAD ("", &wads[0]);
		}
	}

	if (iwadparm == NULL || wads[0].Path.IsEmpty() || mIWads[wads[0].Type].Required.IsNotEmpty())
	{
		if (GameConfig->SetSection ("IWADSearch.Directories"))
		{
			const char *key;
			const char *value;

			while (GameConfig->NextInSection (key, value))
			{
				if (stricmp (key, "Path") == 0)
				{
					FString nice = NicePath(value);
					FixPathSeperator(nice);
					CheckIWAD(nice, &wads[0]);
				}
			}
		}
		TArray<FString> gog_paths = I_GetGogPaths();
		for (i = 0; i < gog_paths.Size(); ++i)
		{
			CheckIWAD (gog_paths[i], &wads[0]);
		}
		TArray<FString> steam_path = I_GetSteamPath();
		for (i = 0; i < steam_path.Size(); ++i)
		{
			CheckIWAD (steam_path[i], &wads[0]);
		}
	}

	if (iwadparm != NULL && !wads[0].Path.IsEmpty())
	{
		iwadparmfound = true;
	}

	for (i = numwads = 0; i < mIWadNames.Size(); i++)
	{
		if (!wads[i].Path.IsEmpty())
		{
			if (i != numwads)
			{
				wads[numwads] = wads[i];
			}
			foundwads[wads[numwads].Type] = numwads + 1;
			numwads++;
		}
	}

	for (unsigned i=0; i<mIWads.Size(); i++)
	{
		if (mIWads[i].Required.IsNotEmpty() && foundwads[i])
		{
			bool found = false;
			// needs to be loaded with another IWAD (HexenDK)
			for (unsigned j=0; j<mIWads.Size(); j++)
			{
				if (!mIWads[i].Required.Compare(mIWads[j].Name))
				{
					if (foundwads[j])
					{
						found = true;
						mIWads[i].preload = j;
					}
					break;
				}
			}
			// The required WAD is not there so this one can't be used and must be deleted from the list
			if (!found)
			{
				size_t kill = foundwads[i];
				for (size_t j = kill; j < numwads; ++j)
				{
					wads[j - 1] = wads[j];
				}
				numwads--;
				foundwads[i] = 0;
				for (unsigned j = 0; j < foundwads.Size(); ++j)
				{
					if (foundwads[j] > kill)
					{
						foundwads[j]--;
					}
				}

			}
		}
	}

	if (numwads == 0)
	{
		I_FatalError ("Cannot find a game IWAD (doom.wad, doom2.wad, heretic.wad, etc.).\n"
					  "Did you install " GAMENAME " properly? You can do either of the following:\n"
					  "\n"
#if defined(_WIN32)
					  "1. Place one or more of these wads in the same directory as " GAMENAME ".\n"
					  "2. Edit your " GAMENAMELOWERCASE "-username.ini and add the directories of your iwads\n"
					  "to the list beneath [IWADSearch.Directories]");
#elif defined(__APPLE__)
					  "1. Place one or more of these wads in ~/Library/Application Support/GZdoom/\n"
					  "2. Edit your ~/Library/Application Support/GZdoom/GZdoom.ini and add the directories\n"
					  "of your iwads to the list beneath [IWADSearch.Directories]");
#else
					  "1. Place one or more of these wads in ~/.config/" GAMENAMELOWERCASE "/.\n"
					  "2. Edit your ~/.config/" GAMENAMELOWERCASE "/" GAMENAMELOWERCASE ".ini and add the directories of your\n"
					  "iwads to the list beneath [IWADSearch.Directories]");
#endif
	}

	pickwad = 0;

	if (!iwadparmfound && numwads > 1)
	{
		int defiwad = 0;

		// Locate the user's prefered IWAD, if it was found.
		if (defaultiwad[0] != '\0')
		{
			for (i = 0; i < numwads; ++i)
			{
				FString basename = ExtractFileBase(wads[i].Path);
				if (stricmp(basename, defaultiwad) == 0)
				{
					defiwad = (int)i;
					break;
				}
			}
		}
		if (!havepicked)	// just use the first IWAD if the restart doesn't have a -iwad parameter. We cannot open the picker in fullscreen mode.
		{
			pickwad = I_PickIWad(&wads[0], (int)numwads, queryiwad, defiwad);
			if (pickwad >= 0)
			{
				// The newly selected IWAD becomes the new default
				FString basename = ExtractFileBase(wads[pickwad].Path);
				defaultiwad = basename;
			}
			if (pickwad < 0)
				exit(0);
			havepicked = true;
		}
	}

	// zdoom.pk3 must always be the first file loaded and the IWAD second.
	wadfiles.Clear();
	D_AddFile (wadfiles, zdoom_wad);

	if (mIWads[wads[pickwad].Type].preload >= 0)
	{
		D_AddFile (wadfiles, wads[foundwads[mIWads[wads[pickwad].Type].preload]-1].Path);
	}
	D_AddFile (wadfiles, wads[pickwad].Path);

	for (unsigned i=0; i < mIWads[wads[pickwad].Type].Load.Size(); i++)
	{
		long lastslash = wads[pickwad].Path.LastIndexOf ('/');
		FString path;

		if (lastslash == -1)
		{
			path = "";//  wads[pickwad].Path;
		}
		else
		{
			path = FString (wads[pickwad].Path.GetChars(), lastslash + 1);
		}
		path += mIWads[wads[pickwad].Type].Load[i];
		D_AddFile (wadfiles, path);

	}
	return wads[pickwad].Type;
}